

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O0

string * __thiscall BeliefSparse::SoftPrint_abi_cxx11_(BeliefSparse *this)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  char *pcVar4;
  const_iterator *this_00;
  const_reference pdVar5;
  int __c;
  long in_RSI;
  string *in_RDI;
  BScit it;
  stringstream ss;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffdc8;
  ostream *in_stack_fffffffffffffdd0;
  char local_1c8 [16];
  const_iterator local_1b8 [2];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,"[");
  sVar3 = boost::numeric::ublas::
          compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)(in_RSI + 8));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,"]< ");
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::begin(in_stack_fffffffffffffdc8);
  while( true ) {
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::end(in_stack_fffffffffffffdc8);
    pcVar4 = local_1c8;
    bVar1 = boost::numeric::ublas::
            bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
            ::operator!=((bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
                          *)in_stack_fffffffffffffdd0,
                         (derived_iterator_type *)in_stack_fffffffffffffdc8);
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::const_iterator::~const_iterator((const_iterator *)0x9c2628);
    if (!bVar1) break;
    pcVar4 = boost::numeric::ublas::
             compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::const_iterator::index(local_1b8,pcVar4,__c);
    poVar2 = (ostream *)std::ostream::operator<<(local_188,(ulong)pcVar4);
    this_00 = (const_iterator *)std::operator<<(poVar2,":");
    pdVar5 = boost::numeric::ublas::
             compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::const_iterator::operator*(this_00);
    in_stack_fffffffffffffdd0 = (ostream *)std::ostream::operator<<(this_00,*pdVar5);
    std::operator<<(in_stack_fffffffffffffdd0," ");
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::const_iterator::operator++(local_1b8);
  }
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::const_iterator::~const_iterator((const_iterator *)0x9c263d);
  std::operator<<(local_188,">");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string BeliefSparse::SoftPrint() const
{
#if BeliefSparse_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
    stringstream ss;
    ss << "[" << _m_b.size() << "]< ";
    for(BScit it=_m_b.begin();
        it!=_m_b.end(); ++it)
        ss << it.index() << ":" << *it << " ";
    ss << ">";
    return(ss.str());
}